

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaSampleFormat GetAvailableFormats(snd_pcm_t *pcm)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  ulong uVar5;
  undefined1 *__s;
  ulong uVar6;
  undefined8 uStack_30;
  
  uStack_30 = 0x10f0cc;
  __n = snd_pcm_hw_params_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar2;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f0ea;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f0f5;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0xe;
  uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f103;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 10;
  uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f11a;
  iVar4 = snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  uVar5 = (ulong)(-1 < iVar3) + 2;
  if (iVar4 < 0) {
    uVar5 = (ulong)(-1 < iVar3);
  }
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x20;
  uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f132;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  uVar6 = uVar5 + 4;
  if (iVar3 < 0) {
    uVar6 = uVar5;
  }
  *(undefined8 *)((long)&uStack_30 + lVar2) = 2;
  uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f14b;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  uVar5 = uVar6 + 8;
  if (iVar3 < 0) {
    uVar5 = uVar6;
  }
  *(undefined8 *)((long)&uStack_30 + lVar2) = 1;
  uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f163;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  uVar6 = uVar5 | 0x20;
  if (iVar3 < 0) {
    uVar6 = uVar5;
  }
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10f17d;
  iVar3 = snd_pcm_hw_params_test_format(pcm,__s,0);
  uVar5 = uVar6 | 0x10;
  if (iVar3 < 0) {
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

static PaSampleFormat GetAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        available |= paFloat32;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        available |= paInt32;

#ifdef PA_LITTLE_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        available |= paInt24;
#elif defined PA_BIG_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        available |= paInt24;
#endif

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        available |= paInt16;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        available |= paUInt8;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        available |= paInt8;

    return available;
}